

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O3

bool __thiscall EOPlus::Lexer::GetChar(Lexer *this,char *c)

{
  uint uVar1;
  long *plVar2;
  variant local_b0;
  undefined1 local_70 [24];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  bool bStack_37;
  bool bStack_36;
  bool bStack_35;
  bool bStack_34;
  undefined3 uStack_33;
  var_type local_30;
  int local_28;
  
  plVar2 = (long *)std::istream::get((char *)this->is);
  uVar1 = *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20);
  if (((uVar1 & 5) == 0) && (this->col = this->col + 1, *c == '\n')) {
    util::variant::variant(&local_b0);
    local_70._0_4_ = NewLine;
    local_70._8_4_ = local_b0.val_int;
    local_70._12_4_ = local_b0._4_4_;
    local_70._16_4_ = local_b0.val_float._0_4_;
    local_70._20_4_ = local_b0.val_float._4_4_;
    local_58._M_p = (pointer)&local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_b0.val_string._M_dataplus._M_p,
               local_b0.val_string._M_dataplus._M_p + local_b0.val_string._M_string_length);
    local_30 = local_b0.type;
    local_38 = local_b0.val_bool;
    bStack_37 = local_b0.cache_val[0];
    bStack_36 = local_b0.cache_val[1];
    bStack_35 = local_b0.cache_val[2];
    bStack_34 = local_b0.cache_val[3];
    uStack_33 = local_b0._53_3_;
    local_28 = 0;
    std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::emplace_back<EOPlus::Token>
              (&(this->token_buffer).c,(Token *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.val_string._M_dataplus._M_p != &local_b0.val_string.field_2) {
      operator_delete(local_b0.val_string._M_dataplus._M_p,
                      local_b0.val_string.field_2._M_allocated_capacity + 1);
    }
    this->row = this->row + 1;
    this->col = 0;
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool Lexer::GetChar(char& c)
	{
		if (!is.get(c))
			return false;

		++this->col;

		if (c == '\n')
		{
			this->token_buffer.push(Token(Token::NewLine));
			++this->row;
			this->col = 0;
		}

		return true;
	}